

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Xxx::~Xxx(Xxx *this)

{
  long lVar1;
  ostream *poVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->size != 0) {
    if (this->buffer != (char *)0x0) {
      operator_delete__(this->buffer);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"delete buffer(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,")\n");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Xxx(void)
    {
        if (0 < size)
        {
            delete [] buffer;
            std::cout << "delete buffer(" << size << ")\n";
        }
    }